

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O2

HaF32 * __thiscall
HACD::MyWuQuantizer::wuQuantize3D
          (MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices,bool denormalizeResults,
          HaU32 maxVertices,HaU32 *outputCount)

{
  Vec3Vector *outputVertices;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  uint uVar6;
  Vec3 *pVVar7;
  HaU32 i_1;
  HaU32 i;
  HaU32 HVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  WuColorQuantizer wcq;
  WuColorQuantizer local_458;
  
  *outputCount = 0;
  normalizeInput(this,vcount,vertices);
  WuColorQuantizer::WuColorQuantizer(&local_458);
  for (HVar8 = 0; vcount != HVar8; HVar8 = HVar8 + 1) {
    pVVar7 = hacd::vector<HACD::Vec3>::operator[](&this->mNormalizedInput,HVar8);
    WuColorQuantizer::addColor(&local_458,pVVar7->x,pVVar7->y,pVVar7->z);
  }
  outputVertices = &this->mQuantizedOutput;
  WuColorQuantizer::Quantize(&local_458,maxVertices,outputVertices);
  uVar6 = (this->mQuantizedOutput).mSize;
  *outputCount = uVar6;
  if (uVar6 == 0) {
    pVVar7 = (Vec3 *)0x0;
  }
  else {
    if (denormalizeResults) {
      for (HVar8 = 0; HVar8 < uVar6; HVar8 = HVar8 + 1) {
        pVVar7 = hacd::vector<HACD::Vec3>::operator[](outputVertices,HVar8);
        auVar9 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).x),ZEXT416((uint)pVVar7->x),
                                 ZEXT416((uint)(this->mCenter).x));
        auVar10._0_4_ = auVar9._0_4_;
        pVVar7->x = auVar10._0_4_;
        auVar10._4_4_ = auVar10._0_4_;
        auVar10._8_4_ = auVar10._0_4_;
        auVar10._12_4_ = auVar10._0_4_;
        uVar1 = (this->mScale).y;
        uVar4 = (this->mScale).z;
        auVar9._4_4_ = uVar4;
        auVar9._0_4_ = uVar1;
        auVar9._8_8_ = 0;
        uVar2 = (this->mCenter).y;
        uVar5 = (this->mCenter).z;
        auVar11._4_4_ = uVar5;
        auVar11._0_4_ = uVar2;
        auVar11._8_8_ = 0;
        auVar9 = vfmadd213ps_fma(auVar10,auVar9,auVar11);
        uVar3 = vmovlps_avx(auVar9);
        pVVar7->y = (HaF32)(int)uVar3;
        pVVar7->z = (HaF32)(int)((ulong)uVar3 >> 0x20);
        hacd::vector<HACD::Vec3>::push_back(outputVertices,pVVar7);
        uVar6 = *outputCount;
      }
    }
    pVVar7 = hacd::vector<HACD::Vec3>::operator[](outputVertices,0);
  }
  WuColorQuantizer::~WuColorQuantizer(&local_458);
  return &pVVar7->x;
}

Assistant:

virtual const hacd::HaF32 * wuQuantize3D(hacd::HaU32 vcount,
		const hacd::HaF32 *vertices,
		bool denormalizeResults,
		hacd::HaU32 maxVertices,
		hacd::HaU32 &outputCount)
	{
		const hacd::HaF32 *ret = NULL;
		outputCount = 0;

		normalizeInput(vcount,vertices);

		WuColorQuantizer wcq;

		for (HaU32 i=0; i<vcount; i++)
		{
			const Vec3 &v = mNormalizedInput[i];
			wcq.addColor(v.x,v.y,v.z);
		}

		wcq.Quantize(maxVertices,mQuantizedOutput);

		outputCount = (HaU32)mQuantizedOutput.size();

		if ( outputCount > 0 )
		{
			if ( denormalizeResults )
			{
				for (HaU32 i=0; i<outputCount; i++)
				{
					Vec3 &v = mQuantizedOutput[i];
					v.x = v.x*mScale.x + mCenter.x;
					v.y = v.x*mScale.y + mCenter.y;
					v.z = v.x*mScale.z + mCenter.z;
					mQuantizedOutput.push_back(v);
				}
			}
			ret = &mQuantizedOutput[0].x;
		}


		return ret;
	}